

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O2

void libtorrent::detail::escape_string(string *ret,char *str,int len)

{
  ulong uVar1;
  char tmp [5];
  
  if (len < 1) {
    len = 0;
  }
  for (uVar1 = 0; (uint)len != uVar1; uVar1 = uVar1 + 1) {
    if ((byte)(str[uVar1] + 0x81U) < 0xa1) {
      snprintf(tmp,5,"\\x%02x");
      std::__cxx11::string::append((char *)ret);
    }
    else {
      std::__cxx11::string::push_back((char)ret);
    }
  }
  return;
}

Assistant:

void escape_string(std::string& ret, char const* str, int len)
	{
		for (int i = 0; i < len; ++i)
		{
			if (str[i] >= 32 && str[i] < 127)
			{
				ret += str[i];
			}
			else
			{
				char tmp[5];
				std::snprintf(tmp, sizeof(tmp), "\\x%02x", std::uint8_t(str[i]));
				ret += tmp;
			}
		}
	}